

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProgramInterfaces.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderProgramInterfaces::iterate(TessellationShaderProgramInterfaces *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar4;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  char *local_2b0;
  GLenum local_284;
  MessageBuilder local_258;
  GLuint local_d4;
  GLuint local_d0;
  GLuint resource_index;
  GLint n_resource_1;
  GLint n_active_resources_1;
  char *resource_name;
  GLenum local_b8;
  GLint te_property_value;
  GLenum te_property;
  GLint tc_property_value;
  GLenum tc_property;
  int n_resource;
  bool was_te_atomic_counter_buffer_reported;
  GLenum GStack_a0;
  bool was_tc_atomic_counter_buffer_reported;
  GLint n_active_resources;
  GLenum property;
  int n_iteration;
  char *te_resource_name;
  char *tc_resource_name;
  uint local_80;
  GLenum interface;
  uint n_interface;
  uint n_interfaces;
  GLenum interfaces [7];
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TessellationShaderProgramInterfaces *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Tessellation shader functionality not supported, skipping",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  _n_interface = 0x92e2000092e1;
  interfaces[0] = 0x92c0;
  interfaces[1] = 0x92e6;
  interfaces[2] = 0x92e5;
  interfaces[3] = 0x92e3;
  interfaces[4] = 0x92e4;
  interface = 7;
  local_80 = 0;
  do {
    if (6 < local_80) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    tc_resource_name._4_4_ = (&n_interface)[local_80];
    if ((((tc_resource_name._4_4_ != 0x92e6) && (tc_resource_name._4_4_ != 0x92e5)) ||
        ((this->m_is_shader_storage_blocks_supported & 1U) != 0)) &&
       ((tc_resource_name._4_4_ != 0x92c0 || ((this->m_is_atomic_counters_supported & 1U) != 0)))) {
      te_resource_name = (char *)0x0;
      _property = (char *)0x0;
      switch(tc_resource_name._4_4_) {
      case 0x92c0:
        break;
      default:
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unrecognized interface type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                   ,0x1a3);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      case 0x92e1:
        te_resource_name = "tc_uniform1";
        _property = "te_uniform1";
        break;
      case 0x92e2:
        te_resource_name = "tc_uniform_block1";
        _property = "te_uniform_block1";
        break;
      case 0x92e3:
        te_resource_name = (char *)0x0;
        _property = (char *)0x0;
        break;
      case 0x92e4:
        te_resource_name = (char *)0x0;
        _property = (char *)0x0;
        break;
      case 0x92e5:
        te_resource_name = "tc_shader_storage_buffer_object_1";
        _property = "te_shader_storage_buffer_object_1";
        break;
      case 0x92e6:
        te_resource_name = "tc_shader_storage_block1";
        _property = "te_shader_storage_block1";
      }
      for (n_active_resources = 0; n_active_resources < 2;
          n_active_resources = n_active_resources + 1) {
        if (n_active_resources == 0) {
          local_284 = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_TESS_CONTROL_SHADER;
        }
        else {
          local_284 = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_TESS_EVALUATION_SHADER;
        }
        GStack_a0 = local_284;
        if (tc_resource_name._4_4_ == 0x92c0) {
          if (n_active_resources != 1) {
            n_resource = 0;
            (**(code **)(local_18 + 0x990))(this->m_po_id,0x92c0,0x92f5,&n_resource);
            dVar2 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar2,"glGetProgramInterfaceiv() failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                            ,0x1bd);
            if (n_resource != 2) {
              pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar4,"Invalid amount of atomic counter buffer binding points reported",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                         ,0x1c1);
              __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            tc_property._3_1_ = 0;
            tc_property._2_1_ = 0;
            for (tc_property_value = 0; tc_property_value < n_resource;
                tc_property_value = tc_property_value + 1) {
              te_property = (this->super_TestCaseBase).m_glExtTokens.
                            REFERENCED_BY_TESS_CONTROL_SHADER;
              te_property_value = 0;
              local_b8 = (this->super_TestCaseBase).m_glExtTokens.
                         REFERENCED_BY_TESS_EVALUATION_SHADER;
              resource_name._4_4_ = 0;
              (**(code **)(local_18 + 0x9c8))
                        (this->m_po_id,tc_resource_name._4_4_,tc_property_value,1,&te_property,1,0,
                         &te_property_value);
              dVar2 = (**(code **)(local_18 + 0x800))();
              glu::checkError(dVar2,
                              "glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_CONTROL_SHADER_EXT property"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                              ,0x1d5);
              (**(code **)(local_18 + 0x9c8))
                        (this->m_po_id,tc_resource_name._4_4_,tc_property_value,1,&local_b8,1,0,
                         (long)&resource_name + 4);
              dVar2 = (**(code **)(local_18 + 0x800))();
              glu::checkError(dVar2,
                              "glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_EVALUATION_SHADER_EXT property"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                              ,0x1dd);
              if (te_property_value == 1) {
                if ((tc_property._3_1_ & 1) != 0) {
                  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar4,
                             "Tessellation control-specific atomic counter buffer is reported twice"
                             ,(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                             ,0x1e3);
                  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
                tc_property._3_1_ = 1;
              }
              if (resource_name._4_4_ == 1) {
                if ((tc_property._2_1_ & 1) != 0) {
                  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar4,
                             "Tessellation evaluation-specific atomic counter buffer is reported twice"
                             ,(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                             ,0x1ed);
                  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
                tc_property._2_1_ = 1;
              }
            }
            if (((tc_property._3_1_ & 1) == 0) || ((tc_property._2_1_ & 1) == 0)) {
              pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar4,
                         "Either tessellation control or tessellation evaluation atomic counter buffer was not reported"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                         ,0x1f7);
              __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
        }
        else {
          if (n_active_resources == 0) {
            local_2b0 = te_resource_name;
          }
          else {
            local_2b0 = _property;
          }
          _n_resource_1 = local_2b0;
          if (local_2b0 == (char *)0x0) {
            resource_index = 0;
            (**(code **)(local_18 + 0x990))
                      (this->m_po_id,tc_resource_name._4_4_,0x92f5,&resource_index);
            dVar2 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar2,"glGetProgramInterfaceiv() failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                            ,0x209);
            for (local_d0 = 0; (int)local_d0 < (int)resource_index; local_d0 = local_d0 + 1) {
              verifyPropertyValue(this,tc_resource_name._4_4_,GStack_a0,local_d0,0);
            }
          }
          else {
            local_d4 = (**(code **)(local_18 + 0x9a8))
                                 (this->m_po_id,tc_resource_name._4_4_,local_2b0);
            dVar2 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar2,"glGetProgramResourceIndex() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                            ,0x213);
            if (local_d4 == 0xffffffff) {
              this_01 = tcu::TestContext::getLog
                                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                   m_testCtx);
              tcu::TestLog::operator<<
                        (&local_258,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar5 = tcu::MessageBuilder::operator<<(&local_258,(char (*) [11])"Resource [");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&n_resource_1);
              pMVar5 = tcu::MessageBuilder::operator<<
                                 (pMVar5,(char (*) [22])"] was not recognized.");
              tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_258);
              pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar4,"Resource not recognized.",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                         ,0x21a);
              __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            verifyPropertyValue(this,tc_resource_name._4_4_,GStack_a0,local_d4,1);
          }
        }
      }
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderProgramInterfaces::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES objects needed to run the test */
	initTest();

	/* Iterate through all interfaces */
	const glw::GLenum interfaces[] = {
		GL_UNIFORM,			GL_UNIFORM_BLOCK, GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BLOCK,
		GL_BUFFER_VARIABLE, GL_PROGRAM_INPUT, GL_PROGRAM_OUTPUT
	};
	const unsigned int n_interfaces = sizeof(interfaces) / sizeof(interfaces[0]);

	for (unsigned int n_interface = 0; n_interface < n_interfaces; ++n_interface)
	{
		glw::GLenum interface = interfaces[n_interface];

		if ((interface == GL_SHADER_STORAGE_BLOCK || interface == GL_BUFFER_VARIABLE) &&
			!m_is_shader_storage_blocks_supported)
		{
			continue;
		}

		if (interface == GL_ATOMIC_COUNTER_BUFFER && !m_is_atomic_counters_supported)
		{
			continue;
		}

		/* For each interface, we want to check whether a specific resource
		 * is recognized by the implementation. If the name is unknown,
		 * the test should fail; if it's recognized, we should verify it's referenced
		 * by both TC and TE shaders
		 */
		const char* tc_resource_name = DE_NULL;
		const char* te_resource_name = DE_NULL;

		switch (interface)
		{
		case GL_UNIFORM:
		{
			tc_resource_name = "tc_uniform1";
			te_resource_name = "te_uniform1";

			break;
		}

		case GL_UNIFORM_BLOCK:
		{
			tc_resource_name = "tc_uniform_block1";
			te_resource_name = "te_uniform_block1";

			break;
		}

		case GL_ATOMIC_COUNTER_BUFFER:
		{
			/* Atomic counter buffers are tested in a separate codepath. */
			break;
		}

		case GL_SHADER_STORAGE_BLOCK:
		{
			tc_resource_name = "tc_shader_storage_block1";
			te_resource_name = "te_shader_storage_block1";

			break;
		}

		case GL_BUFFER_VARIABLE:
		{
			tc_resource_name = "tc_shader_storage_buffer_object_1";
			te_resource_name = "te_shader_storage_buffer_object_1";

			break;
		}

		case GL_PROGRAM_INPUT:
		{
			tc_resource_name = DE_NULL;
			te_resource_name = DE_NULL;

			break;
		}

		case GL_PROGRAM_OUTPUT:
		{
			tc_resource_name = DE_NULL;
			te_resource_name = DE_NULL;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized interface type");
		}
		} /* switch (interface) */

		/* Run in two iterations - first for TC, then for TE */
		for (int n_iteration = 0; n_iteration < 2; ++n_iteration)
		{
			glw::GLenum property = (n_iteration == 0) ? m_glExtTokens.REFERENCED_BY_TESS_CONTROL_SHADER :
														m_glExtTokens.REFERENCED_BY_TESS_EVALUATION_SHADER;

			if (interface == GL_ATOMIC_COUNTER_BUFFER)
			{
				/* We only need a single iteration run for this interface */
				if (n_iteration == 1)
				{
					continue;
				}

				/* Atomic counter buffers are not assigned names, hence they need to be
				 * tested slightly differently.
				 *
				 * Exactly two atomic counter buffers should be defined. Make sure that's the case.
				 */
				glw::GLint n_active_resources = 0;

				gl.getProgramInterfaceiv(m_po_id, interface, GL_ACTIVE_RESOURCES, &n_active_resources);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() failed.");

				if (n_active_resources != 2)
				{
					TCU_FAIL("Invalid amount of atomic counter buffer binding points reported");
				}

				/* Check both resources and make sure they report separate atomic counters */
				bool was_tc_atomic_counter_buffer_reported = false;
				bool was_te_atomic_counter_buffer_reported = false;

				for (int n_resource = 0; n_resource < n_active_resources; ++n_resource)
				{
					const glw::GLenum tc_property		= m_glExtTokens.REFERENCED_BY_TESS_CONTROL_SHADER;
					glw::GLint		  tc_property_value = 0;
					const glw::GLenum te_property		= m_glExtTokens.REFERENCED_BY_TESS_EVALUATION_SHADER;
					glw::GLint		  te_property_value = 0;

					gl.getProgramResourceiv(m_po_id, interface, n_resource, 1, /* propCount */
											&tc_property, 1,				   /* bufSize */
											NULL,							   /* length */
											&tc_property_value);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_CONTROL_SHADER_EXT property");

					gl.getProgramResourceiv(m_po_id, interface, n_resource, 1, /* propCount */
											&te_property, 1,				   /* bufSize */
											NULL,							   /* length */
											&te_property_value);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_EVALUATION_SHADER_EXT property");

					if (tc_property_value == GL_TRUE)
					{
						if (was_tc_atomic_counter_buffer_reported)
						{
							TCU_FAIL("Tessellation control-specific atomic counter buffer is reported twice");
						}

						was_tc_atomic_counter_buffer_reported = true;
					}

					if (te_property_value == GL_TRUE)
					{
						if (was_te_atomic_counter_buffer_reported)
						{
							TCU_FAIL("Tessellation evaluation-specific atomic counter buffer is reported twice");
						}

						was_te_atomic_counter_buffer_reported = true;
					}
				} /* for (all active resources) */

				if (!was_tc_atomic_counter_buffer_reported || !was_te_atomic_counter_buffer_reported)
				{
					TCU_FAIL("Either tessellation control or tessellation evaluation atomic counter buffer was not "
							 "reported");
				}
			}
			else
			{
				/* Retrieve resource index first, as long as the name is not NULL.
				 * If it's NULL, the property's value is assumed to be GL_FALSE for
				 * all reported active resources.
				 **/
				const char* resource_name = (n_iteration == 0) ? tc_resource_name : te_resource_name;

				if (resource_name == DE_NULL)
				{
					/* Make sure the property has GL_FALSE value for any resources
					 * reported for this interface. */
					glw::GLint n_active_resources = 0;

					gl.getProgramInterfaceiv(m_po_id, interface, GL_ACTIVE_RESOURCES, &n_active_resources);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() failed.");

					for (glw::GLint n_resource = 0; n_resource < n_active_resources; ++n_resource)
					{
						verifyPropertyValue(interface, property, n_resource, GL_FALSE);
					} /* for (all resource indices) */
				}
				else
				{
					glw::GLuint resource_index = gl.getProgramResourceIndex(m_po_id, interface, resource_name);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceIndex() failed");

					if (resource_index == GL_INVALID_INDEX)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Resource [" << resource_name
										   << "] was not recognized." << tcu::TestLog::EndMessage;

						TCU_FAIL("Resource not recognized.");
					}

					/* Now that we know the index, we can check the GL_REFERENCED_BY_...
					 * property value */
					verifyPropertyValue(interface, property, resource_index, GL_TRUE);
				}
			} /* (interface != GL_ATOMIC_COUNTER_BUFFER) */
		}	 /* for (both iterations) */
	}		  /* for (all interfaces) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}